

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

size_t sk_net_write_oob(Socket *sock,void *buf,size_t len)

{
  if (*(int *)((long)&sock[-8].vt + 4) != 0) {
    __assert_fail("s->outgoingeof == EOF_NO",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                  ,0x4c2,"size_t sk_net_write_oob(Socket *, const void *, size_t)");
  }
  bufchain_clear((bufchain *)(sock + -0xf));
  if (len < 2) {
    memcpy((void *)((long)&sock[-10].vt + 4),buf,len);
    sock[-9].vt = (SocketVtable *)len;
    if (*(char *)((long)&sock[-10].vt + 1) == '\x01') {
      try_send((NetSocket *)(sock + -0x12));
    }
    uxsel_tell((NetSocket *)(sock + -0x12));
    return (size_t)sock[-9].vt;
  }
  __assert_fail("len <= sizeof(s->oobdata)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c",
                0x4c8,"size_t sk_net_write_oob(Socket *, const void *, size_t)");
}

Assistant:

static size_t sk_net_write_oob(Socket *sock, const void *buf, size_t len)
{
    NetSocket *s = container_of(sock, NetSocket, sock);

    assert(s->outgoingeof == EOF_NO);

    /*
     * Replace the buffer list on the socket with the data.
     */
    bufchain_clear(&s->output_data);
    assert(len <= sizeof(s->oobdata));
    memcpy(s->oobdata, buf, len);
    s->sending_oob = len;

    /*
     * Now try sending from the start of the buffer list.
     */
    if (s->writable)
        try_send(s);

    /*
     * Update the select() status to correctly reflect whether or
     * not we should be selecting for write.
     */
    uxsel_tell(s);

    return s->sending_oob;
}